

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O0

ssize_t __thiscall pbrt::BinaryWriter::write(BinaryWriter *this,int __fd,void *__buf,size_t __n)

{
  ssize_t extraout_RAX;
  undefined4 in_register_00000034;
  size_t unaff_retaddr;
  void *in_stack_00000008;
  BinaryWriter *in_stack_00000010;
  BinaryWriter *in_stack_ffffffffffffffe0;
  
  std::__cxx11::string::size();
  write<int>(in_stack_ffffffffffffffe0,(int *)this);
  std::__cxx11::string::operator[](CONCAT44(in_register_00000034,__fd));
  std::__cxx11::string::size();
  writeRaw(in_stack_00000010,in_stack_00000008,unaff_retaddr);
  return extraout_RAX;
}

Assistant:

void write(const std::string &t)
    {
      write((int32_t)t.size());
      writeRaw(&t[0],t.size());
    }